

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLErrorCodes.hpp
# Opt level: O2

ErrTypes xercesc_4_0::XMLErrs::errorType(Codes toCheck)

{
  ErrTypes EVar1;
  
  EVar1 = ErrType_Warning;
  if (10 < toCheck - W_LowBounds) {
    if (toCheck - F_LowBounds < 0x85) {
      return ErrType_Fatal;
    }
    EVar1 = (uint)(0x8e < toCheck - E_LowBounds) * 2 + ErrType_Error;
  }
  return EVar1;
}

Assistant:

static XMLErrorReporter::ErrTypes errorType(const XMLErrs::Codes toCheck)
    {
       if ((toCheck >= W_LowBounds) && (toCheck <= W_HighBounds))
           return XMLErrorReporter::ErrType_Warning;
       else if ((toCheck >= F_LowBounds) && (toCheck <= F_HighBounds))
            return XMLErrorReporter::ErrType_Fatal;
       else if ((toCheck >= E_LowBounds) && (toCheck <= E_HighBounds))
            return XMLErrorReporter::ErrType_Error;
       return XMLErrorReporter::ErrTypes_Unknown;
    }